

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

int absl::lts_20250127::synchronization_internal::MutexDelay(int32_t c,int mode)

{
  int iVar1;
  uint uVar2;
  MutexGlobals *pMVar3;
  uint32_t extraout_EDX;
  Duration duration;
  ScopedEnable local_24;
  HiRep HStack_20;
  ScopedEnable enable_rescheduling;
  Duration sleep_time;
  int32_t limit;
  int mode_local;
  int32_t c_local;
  
  pMVar3 = anon_unknown_11::GetMutexGlobals();
  iVar1 = pMVar3->mutex_sleep_spins[mode];
  pMVar3 = anon_unknown_11::GetMutexGlobals();
  HStack_20 = (pMVar3->mutex_sleep_time).rep_hi_;
  uVar2 = (pMVar3->mutex_sleep_time).rep_lo_;
  if (c < iVar1) {
    limit = c + 1;
  }
  else {
    base_internal::SchedulingGuard::ScopedEnable::ScopedEnable(&local_24);
    if (c == iVar1) {
      AbslInternalMutexYield_lts_20250127();
      limit = c + 1;
    }
    else {
      duration.rep_hi_.hi_ = 0;
      duration.rep_hi_.lo_ = uVar2;
      duration.rep_lo_ = extraout_EDX;
      SleepFor((lts_20250127 *)HStack_20,duration);
      limit = 0;
    }
    base_internal::SchedulingGuard::ScopedEnable::~ScopedEnable(&local_24);
  }
  return limit;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_spins[mode];
  const absl::Duration sleep_time = GetMutexGlobals().mutex_sleep_time;
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(sleep_time);
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}